

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<int>::begin(QList<int> *this)

{
  int *n;
  QArrayDataPointer<int> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<int> *)0x300e19);
  QArrayDataPointer<int>::operator->(in_RDI);
  n = QArrayDataPointer<int>::begin((QArrayDataPointer<int> *)0x300e2a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }